

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt32
          (OptionInterpreter *this,int number,int32_t value,Type type,
          UnknownFieldSet *unknown_fields)

{
  uint32_t uVar1;
  LogMessage *pLVar2;
  LogMessage local_40;
  Voidify local_29;
  UnknownFieldSet *local_28;
  UnknownFieldSet *unknown_fields_local;
  int32_t local_18;
  Type type_local;
  int32_t value_local;
  int number_local;
  OptionInterpreter *this_local;
  
  local_28 = unknown_fields;
  unknown_fields_local._4_4_ = type;
  local_18 = value;
  type_local = number;
  _value_local = this;
  if (type == TYPE_INT32) {
    UnknownFieldSet::AddVarint(unknown_fields,number,(long)value);
  }
  else if (type == TYPE_SFIXED32) {
    UnknownFieldSet::AddFixed32(unknown_fields,number,value);
  }
  else {
    if (type != TYPE_SINT32) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x2811);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [38])"Invalid wire type for CPPTYPE_INT32: ");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::
               operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                         (pLVar2,(Type *)((long)&unknown_fields_local + 4));
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
    uVar1 = internal::WireFormatLite::ZigZagEncode32(value);
    UnknownFieldSet::AddVarint(unknown_fields,number,(ulong)uVar1);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt32(
    int number, int32_t value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32:
      unknown_fields->AddVarint(
          number, static_cast<uint64_t>(static_cast<int64_t>(value)));
      break;

    case FieldDescriptor::TYPE_SFIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32_t>(value));
      break;

    case FieldDescriptor::TYPE_SINT32:
      unknown_fields->AddVarint(
          number, internal::WireFormatLite::ZigZagEncode32(value));
      break;

    default:
      ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT32: " << type;
      break;
  }
}